

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O1

mz_bool mz_zip_writer_init_file_v2
                  (mz_zip_archive *pZip,char *pFilename,mz_uint64 size_to_reserve_at_beginning,
                  mz_uint flags)

{
  mz_bool mVar1;
  FILE *pFVar2;
  size_t sVar3;
  mz_bool mVar4;
  char *__modes;
  mz_uint64 mVar5;
  size_t sVar6;
  char buf [4096];
  undefined1 auStack_1038 [4104];
  
  pZip->m_pWrite = mz_zip_file_write_func;
  pZip->m_pNeeds_keepalive = (mz_file_needs_keepalive)0x0;
  if ((short)flags < 0) {
    pZip->m_pRead = mz_zip_file_read_func;
  }
  pZip->m_pIO_opaque = pZip;
  mVar1 = mz_zip_writer_init_v2(pZip,size_to_reserve_at_beginning,flags);
  mVar4 = 0;
  if (mVar1 != 0) {
    __modes = "w+b";
    if (-1 < (short)flags) {
      __modes = "wb";
    }
    pFVar2 = fopen64(pFilename,__modes);
    if (pFVar2 == (FILE *)0x0) {
      mz_zip_writer_end_internal(pZip,1);
      mVar4 = 0;
      if (pZip != (mz_zip_archive *)0x0) {
        pZip->m_last_error = MZ_ZIP_FILE_OPEN_FAILED;
      }
    }
    else {
      pZip->m_pState->m_pFile = (FILE *)pFVar2;
      pZip->m_zip_type = MZ_ZIP_TYPE_FILE;
      if (size_to_reserve_at_beginning != 0) {
        mVar5 = 0;
        memset(auStack_1038,0,0x1000);
        do {
          sVar6 = 0x1000;
          if (size_to_reserve_at_beginning < 0x1000) {
            sVar6 = size_to_reserve_at_beginning;
          }
          sVar3 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar5,auStack_1038,sVar6);
          if (sVar3 == sVar6) {
            mVar5 = mVar5 + sVar6;
            size_to_reserve_at_beginning = size_to_reserve_at_beginning - sVar6;
          }
          else {
            mz_zip_writer_end_internal(pZip,1);
            if (pZip != (mz_zip_archive *)0x0) {
              pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
            }
          }
          if (sVar3 != sVar6) {
            return 0;
          }
        } while (size_to_reserve_at_beginning != 0);
      }
      mVar4 = 1;
    }
  }
  return mVar4;
}

Assistant:

mz_bool mz_zip_writer_init_file_v2(mz_zip_archive *pZip, const char *pFilename, mz_uint64 size_to_reserve_at_beginning, mz_uint flags)
{
    MZ_FILE *pFile;

    pZip->m_pWrite = mz_zip_file_write_func;
    pZip->m_pNeeds_keepalive = NULL;

    if (flags & MZ_ZIP_FLAG_WRITE_ALLOW_READING)
        pZip->m_pRead = mz_zip_file_read_func;

    pZip->m_pIO_opaque = pZip;

    if (!mz_zip_writer_init_v2(pZip, size_to_reserve_at_beginning, flags))
        return MZ_FALSE;

    if (NULL == (pFile = MZ_FOPEN(pFilename, (flags & MZ_ZIP_FLAG_WRITE_ALLOW_READING) ? "w+b" : "wb")))
    {
        mz_zip_writer_end(pZip);
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_OPEN_FAILED);
    }

    pZip->m_pState->m_pFile = pFile;
    pZip->m_zip_type = MZ_ZIP_TYPE_FILE;

    if (size_to_reserve_at_beginning)
    {
        mz_uint64 cur_ofs = 0;
        char buf[4096];

        MZ_CLEAR_OBJ(buf);

        do
        {
            size_t n = (size_t)MZ_MIN(sizeof(buf), size_to_reserve_at_beginning);
            if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_ofs, buf, n) != n)
            {
                mz_zip_writer_end(pZip);
                return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
            }
            cur_ofs += n;
            size_to_reserve_at_beginning -= n;
        } while (size_to_reserve_at_beginning);
    }

    return MZ_TRUE;
}